

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transfer.c
# Opt level: O0

CURLcode Curl_xfer_write_resp(Curl_easy *data,char *buf,size_t blen,_Bool is_eos,_Bool *done)

{
  int local_38;
  CURLcode local_34;
  int cwtype;
  CURLcode result;
  _Bool *done_local;
  _Bool is_eos_local;
  size_t blen_local;
  char *buf_local;
  Curl_easy *data_local;
  
  local_34 = CURLE_OK;
  if (data->conn->handler->write_resp ==
      (_func_CURLcode_Curl_easy_ptr_char_ptr_size_t__Bool__Bool_ptr *)0x0) {
    if ((blen != 0) || (is_eos)) {
      local_38 = 1;
      if (is_eos) {
        local_38 = 0x81;
      }
      local_34 = Curl_client_write(data,local_38,buf,blen);
    }
  }
  else {
    local_34 = (*data->conn->handler->write_resp)(data,buf,blen,is_eos,done);
  }
  if ((local_34 == CURLE_OK) && (is_eos)) {
    *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xfff7 | 8;
    *(ushort *)&(data->req).field_0xbb = *(ushort *)&(data->req).field_0xbb & 0xfffb | 4;
  }
  return local_34;
}

Assistant:

CURLcode Curl_xfer_write_resp(struct Curl_easy *data,
                              char *buf, size_t blen,
                              bool is_eos, bool *done)
{
  CURLcode result = CURLE_OK;

  if(data->conn->handler->write_resp) {
    /* protocol handlers offering this function take full responsibility
     * for writing all received download data to the client. */
    result = data->conn->handler->write_resp(data, buf, blen, is_eos, done);
  }
  else {
    /* No special handling by protocol handler, write all received data
     * as BODY to the client. */
    if(blen || is_eos) {
      int cwtype = CLIENTWRITE_BODY;
      if(is_eos)
        cwtype |= CLIENTWRITE_EOS;

#ifndef CURL_DISABLE_POP3
      if(blen && data->conn->handler->protocol & PROTO_FAMILY_POP3) {
        result = data->req.ignorebody? CURLE_OK :
                 Curl_pop3_write(data, buf, blen);
      }
      else
#endif /* CURL_DISABLE_POP3 */
        result = Curl_client_write(data, cwtype, buf, blen);
    }
  }

  if(!result && is_eos) {
    /* If we wrote the EOS, we are definitely done */
    data->req.eos_written = TRUE;
    data->req.download_done = TRUE;
  }
  return result;
}